

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_check_pubkey_mx(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt)

{
  size_t sVar1;
  mbedtls_ecp_point *pt_local;
  mbedtls_ecp_group *grp_local;
  
  sVar1 = mbedtls_mpi_size(&pt->X);
  if (grp->nbits + 7 >> 3 < sVar1) {
    grp_local._4_4_ = -0x4c80;
  }
  else {
    grp_local._4_4_ = 0;
  }
  return grp_local._4_4_;
}

Assistant:

static int ecp_check_pubkey_mx( const mbedtls_ecp_group *grp, const mbedtls_ecp_point *pt )
{
    /* [Curve25519 p. 5] Just check X is the correct number of bytes */
    /* Allow any public value, if it's too big then we'll just reduce it mod p
     * (RFC 7748 sec. 5 para. 3). */
    if( mbedtls_mpi_size( &pt->X ) > ( grp->nbits + 7 ) / 8 )
        return( MBEDTLS_ERR_ECP_INVALID_KEY );

    return( 0 );
}